

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

void __thiscall btRigidBody::saveKinematicState(btRigidBody *this,btScalar timeStep)

{
  btMotionState *pbVar1;
  btRigidBody *in_RDI;
  float in_XMM0_Da;
  btVector3 angVel;
  btVector3 linVel;
  btVector3 *in_stack_00000040;
  btVector3 *in_stack_00000048;
  btScalar in_stack_00000054;
  btTransform *in_stack_00000058;
  btTransform *in_stack_00000060;
  btTransform *in_stack_ffffffffffffffd0;
  btVector3 local_1c;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    pbVar1 = getMotionState(in_RDI);
    if (pbVar1 != (btMotionState *)0x0) {
      pbVar1 = getMotionState(in_RDI);
      (*pbVar1->_vptr_btMotionState[2])(pbVar1,&(in_RDI->super_btCollisionObject).m_worldTransform);
    }
    btVector3::btVector3(&local_1c);
    btVector3::btVector3((btVector3 *)&stack0xffffffffffffffd4);
    btTransformUtil::calculateVelocity
              (in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000048,
               in_stack_00000040);
    *(undefined8 *)(in_RDI->super_btCollisionObject).m_interpolationLinearVelocity.m_floats =
         *(undefined8 *)(in_RDI->m_linearVelocity).m_floats;
    *(undefined8 *)((in_RDI->super_btCollisionObject).m_interpolationLinearVelocity.m_floats + 2) =
         *(undefined8 *)((in_RDI->m_linearVelocity).m_floats + 2);
    *(undefined8 *)(in_RDI->super_btCollisionObject).m_interpolationAngularVelocity.m_floats =
         *(undefined8 *)(in_RDI->m_angularVelocity).m_floats;
    *(undefined8 *)((in_RDI->super_btCollisionObject).m_interpolationAngularVelocity.m_floats + 2) =
         *(undefined8 *)((in_RDI->m_angularVelocity).m_floats + 2);
    btTransform::operator=(in_stack_ffffffffffffffd0,(btTransform *)in_RDI);
  }
  return;
}

Assistant:

void			btRigidBody::saveKinematicState(btScalar timeStep)
{
	//todo: clamp to some (user definable) safe minimum timestep, to limit maximum angular/linear velocities
	if (timeStep != btScalar(0.))
	{
		//if we use motionstate to synchronize world transforms, get the new kinematic/animated world transform
		if (getMotionState())
			getMotionState()->getWorldTransform(m_worldTransform);
		btVector3 linVel,angVel;
		
		btTransformUtil::calculateVelocity(m_interpolationWorldTransform,m_worldTransform,timeStep,m_linearVelocity,m_angularVelocity);
		m_interpolationLinearVelocity = m_linearVelocity;
		m_interpolationAngularVelocity = m_angularVelocity;
		m_interpolationWorldTransform = m_worldTransform;
		//printf("angular = %f %f %f\n",m_angularVelocity.getX(),m_angularVelocity.getY(),m_angularVelocity.getZ());
	}
}